

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbanks_decoder.cpp
# Opt level: O0

string * decode_string_abi_cxx11_
                   (string *__return_storage_ptr__,BitstreamReader *bitstream,
                   vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *huffman_trees)

{
  bool bVar1;
  const_reference ppHVar2;
  byte *pbVar3;
  uint8_t symbol;
  HuffmanTreeNode *local_30;
  HuffmanTreeNode *current_node;
  uint8_t previous_symbol;
  vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *huffman_trees_local;
  BitstreamReader *bitstream_local;
  string *string;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  current_node._6_1_ = 0x55;
  while( true ) {
    ppHVar2 = std::vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_>::operator[]
                        (huffman_trees,(ulong)current_node._6_1_);
    local_30 = HuffmanTree::root_node(*ppHVar2);
    while (bVar1 = HuffmanTreeNode::is_leaf(local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = BitstreamReader::next_bit(bitstream);
      if (bVar1) {
        local_30 = HuffmanTreeNode::right_child(local_30);
      }
      else {
        local_30 = HuffmanTreeNode::left_child(local_30);
      }
    }
    pbVar3 = HuffmanTreeNode::symbol(local_30);
    current_node._6_1_ = *pbVar3;
    if (current_node._6_1_ == 0x55) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,Symbols::TABLE[current_node._6_1_]);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string decode_string(BitstreamReader& bitstream, const std::vector<HuffmanTree*>& huffman_trees)
{
    std::string string;
    uint8_t previous_symbol = 0x55;

    while (true)
    {
        HuffmanTreeNode* current_node = huffman_trees[previous_symbol]->root_node();
        while(!current_node->is_leaf())
        {
            if (bitstream.next_bit())
                current_node = current_node->right_child();
            else
                current_node = current_node->left_child();
        }

        uint8_t symbol = current_node->symbol();
        if (symbol == 0x55)
            break;

        string += Symbols::TABLE[symbol];
        previous_symbol = symbol;
    }

    return string;
}